

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O0

void __thiscall Heap<Astar<Tiles>::Node>::Maxq::push(Maxq *this,Node *n,int p)

{
  size_type sVar1;
  reference this_00;
  uint in_EDX;
  vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_> *in_RSI;
  int *in_RDI;
  vector<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>,_std::allocator<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>_>_>
  *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  int *__new_size;
  
  if (-1 < (int)in_EDX) {
    __new_size = in_RDI;
    sVar1 = std::
            vector<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>,_std::allocator<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>_>_>
            ::size((vector<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>,_std::allocator<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>_>_>
                    *)(in_RDI + 2));
    if (sVar1 <= in_EDX) {
      std::
      vector<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>,_std::allocator<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>_>_>
      ::resize(unaff_retaddr,(size_type)__new_size);
    }
    if (in_RDI[1] < (int)in_EDX) {
      in_RDI[1] = in_EDX;
    }
    this_00 = std::
              vector<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>,_std::allocator<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>_>_>
              ::operator[]((vector<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>,_std::allocator<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>_>_>
                            *)(in_RDI + 2),(long)(int)in_EDX);
    sVar1 = std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>::size(this_00);
    *(int *)((long)&(in_RSI->
                    super__Vector_base<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>)
                    ._M_impl.super__Vector_impl_data._M_start + 4) = (int)sVar1;
    std::
    vector<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>,_std::allocator<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>_>_>
    ::operator[]((vector<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>,_std::allocator<std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>_>_>
                  *)(in_RDI + 2),(long)(int)in_EDX);
    std::vector<Astar<Tiles>::Node_*,_std::allocator<Astar<Tiles>::Node_*>_>::push_back
              (in_RSI,(value_type *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    *in_RDI = *in_RDI + 1;
    return;
  }
  __assert_fail("p >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shunjilin[P]15PuzzleExternalMemorySearch/src/heap.hpp"
                ,0x12,
                "void Heap<Astar<Tiles>::Node>::Maxq::push(HeapElm *, int) [HeapElm = Astar<Tiles>::Node]"
               );
}

Assistant:

void push(HeapElm *n, int p) {
			assert (p >= 0);
			if (bins.size() <= (unsigned int) p)
				bins.resize(p+1);

			if (p > max)
				max = p;

			n->openind = bins[p].size();
			bins[p].push_back(n);
			fill++;
		}